

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kissfft.hh
# Opt level: O1

void __thiscall
kissfft<double>::kf_bfly_generic(kissfft<double> *this,cpx_t *Fout,size_t fstride,size_t m,size_t p)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  pointer pcVar4;
  undefined8 uVar5;
  cpx_t *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  size_t local_98;
  cpx_t *local_88;
  double local_78;
  double dStack_70;
  long local_68;
  long local_60;
  size_t local_58;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_50;
  ulong local_48;
  ulong local_40;
  pointer local_38;
  
  local_38 = (this->_twiddles).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->_scratchbuf;
  local_58 = fstride;
  if ((ulong)((long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < p) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(this_00,p);
  }
  if (m != 0) {
    local_68 = m << 4;
    local_60 = p - 1;
    local_98 = 0;
    local_88 = Fout;
    local_50 = this_00;
    local_48 = p;
    do {
      if (p != 0) {
        lVar7 = 0;
        pcVar6 = local_88;
        uVar8 = p;
        do {
          uVar5 = *(undefined8 *)(pcVar6->_M_value + 8);
          puVar1 = (undefined8 *)
                   (((this_00->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar7);
          *puVar1 = *(undefined8 *)pcVar6->_M_value;
          puVar1[1] = uVar5;
          lVar7 = lVar7 + 0x10;
          pcVar6 = (cpx_t *)(pcVar6->_M_value + local_68);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        local_40 = 0;
        sVar10 = local_98;
        do {
          pcVar4 = (this_00->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)(pcVar4->_M_value + 8);
          *(undefined8 *)Fout[sVar10]._M_value = *(undefined8 *)pcVar4->_M_value;
          *(undefined8 *)(Fout[sVar10]._M_value + 8) = uVar5;
          if (1 < p) {
            pcVar6 = Fout + sVar10;
            lVar9 = sVar10 * local_58;
            lVar11 = 0x10;
            lVar13 = 0;
            lVar7 = local_60;
            do {
              uVar12 = lVar13 + lVar9;
              uVar8 = this->_nfft;
              if (uVar12 < uVar8) {
                uVar8 = 0;
              }
              lVar13 = uVar12 - uVar8;
              pdVar2 = (double *)
                       (((this->_scratchbuf).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar11);
              local_78 = *pdVar2;
              dStack_70 = pdVar2[1];
              std::complex<double>::operator*=((complex<double> *)&local_78,local_38 + lVar13);
              dVar3 = *(double *)(pcVar6->_M_value + 8);
              *(double *)pcVar6->_M_value = local_78 + *(double *)pcVar6->_M_value;
              *(double *)(pcVar6->_M_value + 8) = dStack_70 + dVar3;
              lVar11 = lVar11 + 0x10;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          sVar10 = sVar10 + m;
          local_40 = local_40 + 1;
          p = local_48;
          this_00 = local_50;
        } while (local_40 != local_48);
      }
      local_98 = local_98 + 1;
      local_88 = local_88 + 1;
    } while (local_98 != m);
  }
  return;
}

Assistant:

void kf_bfly_generic(
                cpx_t * const Fout,
                const size_t fstride,
                const std::size_t m,
                const std::size_t p
                ) const
        {
            const cpx_t * twiddles = &_twiddles[0];

            if(p > _scratchbuf.size()) _scratchbuf.resize(p);

            for ( std::size_t u=0; u<m; ++u ) {
                std::size_t k = u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    _scratchbuf[q1] = Fout[ k  ];
                    k += m;
                }

                k=u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    std::size_t twidx=0;
                    Fout[ k ] = _scratchbuf[0];
                    for ( std::size_t q=1;q<p;++q ) {
                        twidx += fstride * k;
                        if (twidx>=_nfft)
                          twidx-=_nfft;
                        Fout[ k ] += _scratchbuf[q] * twiddles[twidx];
                    }
                    k += m;
                }
            }
        }